

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint __thiscall ON_MeshNgonIterator::Count(ON_MeshNgonIterator *this)

{
  uint *puVar1;
  ON_Mesh *pOVar2;
  ON_MeshNgon **ppOVar3;
  ON_MeshNgon *pOVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  pOVar2 = this->m_mesh;
  if (pOVar2 == (ON_Mesh *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (pOVar2->m_F).m_count;
    uVar5 = (pOVar2->m_Ngon).m_count;
    if (uVar5 != 0) {
      ppOVar3 = (pOVar2->m_Ngon).m_a;
      if (ppOVar3 != (ON_MeshNgon **)0x0) {
        uVar6 = 0;
        do {
          pOVar4 = ppOVar3[uVar6];
          if (pOVar4 == (ON_MeshNgon *)0x0) {
            uVar5 = uVar5 - 1;
          }
          else {
            puVar1 = &pOVar4->m_Fcount;
            bVar8 = uVar7 < *puVar1;
            uVar7 = uVar7 - *puVar1;
            if (bVar8) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_ngon.cpp"
                         ,0x15c7,"","Invalid ngon information on mesh");
              return 0;
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar5);
      }
      uVar7 = uVar7 + uVar5;
    }
  }
  return uVar7;
}

Assistant:

unsigned int ON_MeshNgonIterator::Count() const
{
	unsigned int count = 0;

  if (nullptr != m_mesh)
  {
    count = m_mesh->m_F.UnsignedCount();
    unsigned int explicit_ngon_count = m_mesh->NgonUnsignedCount();
    if (explicit_ngon_count > 0)
    {
      // subtract the number of mesh faces that are in explicit ngons from count.
      const ON_MeshNgon* const * ngons = m_mesh->Ngons();
      if (nullptr != ngons)
      {
        for (unsigned int ni = 0; ni < explicit_ngon_count; ni++)
        {
          const ON_MeshNgon* ngon = ngons[ni];
          if (nullptr == ngon)
            explicit_ngon_count--;
          else if (ngon->m_Fcount <= count)
            count -= ngon->m_Fcount;
          else
          {
            ON_ERROR("Invalid ngon information on mesh");
            return 0;
          }
        }
      }

      // add the number of explicit ngons to count
      count += explicit_ngon_count;
    }
  }

  // return the number of explicit ngons + the number of faces that are not in an explicit ngon.
	return count;
}